

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_st_cond(DisasContext_conflict6 *ctx,int rt,int base,int offset,MemOp_conflict2 tcg_mo,
                _Bool eva)

{
  TCGContext_conflict6 *s;
  TCGLabel *l;
  TCGLabel *a1;
  TCGTemp *a1_00;
  TCGTemp *pTVar1;
  TCGv_i64 a2;
  TCGOpcode opc;
  TCGArg idx;
  uintptr_t o_3;
  TCGv_i64 retv;
  TCGv_i64 newv;
  uintptr_t o_4;
  
  s = ctx->uc->tcg_ctx;
  l = gen_new_label_mips64el(s);
  a1 = gen_new_label_mips64el(s);
  a1_00 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  retv = (TCGv_i64)((long)a1_00 - (long)s);
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  gen_base_offset_addr(ctx,(TCGv_i64)((long)pTVar1 - (long)s),base,offset);
  tcg_gen_brcond_i64_mips64el(s,TCG_COND_EQ,(TCGv_i64)((long)pTVar1 - (long)s),s->cpu_lladdr,l);
  tcg_temp_free_internal_mips64el(s,pTVar1);
  tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1_00,0);
  if ((rt != 0) && (s->cpu_gpr[rt] != retv)) {
    tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[rt] + (long)s),(TCGArg)a1_00);
  }
  *(short *)&a1->field_0x2 = (short)((uint)*(ushort *)&a1->field_0x2 * 0x10000 + 0x10000 >> 0x10);
  tcg_gen_op1_mips64el(s,INDEX_op_br,(TCGArg)a1);
  *(byte *)l = *(byte *)l | 1;
  tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)l);
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  newv = (TCGv_i64)((long)pTVar1 - (long)s);
  if (rt == 0) {
    opc = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[rt] == newv) goto LAB_0099e50d;
    a2 = s->cpu_gpr[rt] + (long)s;
    opc = INDEX_op_mov_i64;
  }
  tcg_gen_op2_mips64el(s,opc,(TCGArg)pTVar1,(TCGArg)a2);
LAB_0099e50d:
  idx = 2;
  if (!eva) {
    idx = (TCGArg)ctx->mem_idx;
  }
  tcg_gen_atomic_cmpxchg_i64_mips64el(s,retv,s->cpu_lladdr,s->cpu_llval,newv,idx,tcg_mo);
  tcg_gen_setcond_i64_mips64el(s,TCG_COND_EQ,retv,retv,s->cpu_llval);
  if ((rt != 0) && (s->cpu_gpr[rt] != retv)) {
    tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[rt] + (long)s),(TCGArg)a1_00);
  }
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(newv + (long)s));
  *(byte *)a1 = *(byte *)a1 | 1;
  tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)a1);
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(retv + (long)s));
  return;
}

Assistant:

static void gen_st_cond(DisasContext *ctx, int rt, int base, int offset,
                        MemOp tcg_mo, bool eva)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv addr, t0, val;
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGLabel *done = gen_new_label(tcg_ctx);

    t0 = tcg_temp_new(tcg_ctx);
    addr = tcg_temp_new(tcg_ctx);
    /* compare the address against that of the preceeding LL */
    gen_base_offset_addr(ctx, addr, base, offset);
    tcg_gen_brcond_tl(tcg_ctx, TCG_COND_EQ, addr, tcg_ctx->cpu_lladdr, l1);
    tcg_temp_free(tcg_ctx, addr);
    tcg_gen_movi_tl(tcg_ctx, t0, 0);
    gen_store_gpr(tcg_ctx, t0, rt);
    tcg_gen_br(tcg_ctx, done);

    gen_set_label(tcg_ctx, l1);
    /* generate cmpxchg */
    val = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, val, rt);
    tcg_gen_atomic_cmpxchg_tl(tcg_ctx, t0, tcg_ctx->cpu_lladdr, tcg_ctx->cpu_llval, val,
                              eva ? MIPS_HFLAG_UM : ctx->mem_idx, tcg_mo);
    tcg_gen_setcond_tl(tcg_ctx, TCG_COND_EQ, t0, t0, tcg_ctx->cpu_llval);
    gen_store_gpr(tcg_ctx, t0, rt);
    tcg_temp_free(tcg_ctx, val);

    gen_set_label(tcg_ctx, done);
    tcg_temp_free(tcg_ctx, t0);
}